

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::reportAlgorithmPhase(HighsSimplexAnalysis *this,bool header)

{
  bool bVar1;
  type pbVar2;
  undefined8 uVar3;
  byte in_SIL;
  HighsSimplexAnalysis *in_RDI;
  string algorithm_name;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  string local_60 [48];
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 == 0) {
    std::__cxx11::string::string(local_30);
    bVar1 = dualAlgorithm(in_RDI);
    if (bVar1) {
      std::__cxx11::string::operator=(local_30,"Du");
    }
    else {
      std::__cxx11::string::operator=(local_30,"Pr");
    }
    pbVar2 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(in_stack_ffffffffffffff80);
    pbVar2 = pbVar2 + 0x10;
    uVar3 = std::__cxx11::string::c_str();
    highsFormatToString_abi_cxx11_
              ((char *)local_60,"%2sPh%1d",uVar3,(ulong)(uint)in_RDI->solve_phase);
    std::operator<<((ostream *)pbVar2,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_30);
  }
  else {
    pbVar2 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(in_stack_ffffffffffffff80);
    std::operator<<((ostream *)(pbVar2 + 0x10),"     ");
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportAlgorithmPhase(const bool header) {
  if (header) {
    *analysis_log << "     ";
  } else {
    std::string algorithm_name;
    if (dualAlgorithm()) {
      algorithm_name = "Du";
    } else {
      algorithm_name = "Pr";
    }
    *analysis_log << highsFormatToString("%2sPh%1" HIGHSINT_FORMAT,
                                         algorithm_name.c_str(), solve_phase);
  }
}